

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O2

double duckdb::CSVMultiFileInfo::GetProgressInFile(ClientContext *context,BaseFileReader *reader)

{
  element_type *peVar1;
  undefined8 uVar2;
  double dVar3;
  CSVBufferManager *pCVar4;
  pointer pCVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  double dVar7;
  shared_ptr<duckdb::CSVBufferManager,_true> buffer_manager;
  __shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> local_38;
  undefined1 local_28 [16];
  
  ::std::__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             (__shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2> *)(reader + 1));
  if (local_38._M_ptr == (element_type *)0x0) {
    dVar3 = 100.0;
    dVar7 = 0.0;
    goto LAB_018c33fb;
  }
  pCVar4 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                     ((shared_ptr<duckdb::CSVBufferManager,_true> *)&local_38);
  pCVar5 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
           operator->(&pCVar4->file_handle);
  if (pCVar5->compression_type == GZIP) {
LAB_018c3380:
    pCVar4 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferManager,_true> *)&local_38);
    pCVar5 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
             operator->(&pCVar4->file_handle);
    dVar3 = CSVFileHandle::GetProgress(pCVar5);
    dVar7 = (double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
  }
  else {
    pCVar4 = shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                       ((shared_ptr<duckdb::CSVBufferManager,_true> *)&local_38);
    pCVar5 = unique_ptr<duckdb::CSVFileHandle,_std::default_delete<duckdb::CSVFileHandle>,_true>::
             operator->(&pCVar4->file_handle);
    if (pCVar5->compression_type == ZSTD) goto LAB_018c3380;
    uVar2 = *(undefined8 *)((long)&reader[1].file.path.field_2 + 8);
    auVar6._8_4_ = (int)((ulong)uVar2 >> 0x20);
    auVar6._0_8_ = uVar2;
    auVar6._12_4_ = 0x45300000;
    dVar7 = auVar6._8_8_ - 1.9342813113834067e+25;
    dVar3 = dVar7 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
  }
  peVar1 = reader[1].file.extended_info.internal.
           super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar3 = (dVar3 / (((double)CONCAT44(0x45300000,(int)((ulong)peVar1 >> 0x20)) -
                    1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)peVar1) - 4503599627370496.0))) * 100.0;
LAB_018c33fb:
  local_28._8_4_ = SUB84(dVar7,0);
  local_28._0_8_ = dVar3;
  local_28._12_4_ = (int)((ulong)dVar7 >> 0x20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return (double)local_28._0_8_;
}

Assistant:

double CSVMultiFileInfo::GetProgressInFile(ClientContext &context, const BaseFileReader &reader) {
	auto &csv_scan = reader.Cast<CSVFileScan>();

	auto buffer_manager = csv_scan.buffer_manager;
	if (!buffer_manager) {
		// We are done with this file, so it's 100%
		return 100.0;
	}
	double bytes_read;
	if (buffer_manager->file_handle->compression_type == FileCompressionType::GZIP ||
	    buffer_manager->file_handle->compression_type == FileCompressionType::ZSTD) {
		// compressed file: we care about the progress made in the *underlying* file handle
		// the bytes read from the uncompressed file are skewed
		bytes_read = buffer_manager->file_handle->GetProgress();
	} else {
		bytes_read = static_cast<double>(csv_scan.bytes_read);
	}
	double file_progress = bytes_read / static_cast<double>(csv_scan.file_size);
	return file_progress * 100.0;
}